

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O0

void __thiscall xcardMT::xcardMT(xcardMT *this,string *prefix,int threads,int debug)

{
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int debug_local;
  int threads_local;
  string *prefix_local;
  xcardMT *this_local;
  
  local_20 = debug;
  local_1c = threads;
  _debug_local = prefix;
  prefix_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"-1",&local_41);
  xcard::xcard(&this->super_xcard,(string *)local_40,0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this->max_threads = -1;
  std::__cxx11::string::operator=((string *)this,(string *)prefix);
  (this->super_xcard).debug = local_20;
  if (0 < local_1c) {
    this->max_threads = local_1c;
  }
  return;
}

Assistant:

xcardMT::xcardMT(std::string prefix, int threads, int debug)
{

    this->prefix = prefix;
    this->debug = debug;
    
    if (threads > 0){
    this->max_threads = threads;
    }
}